

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_shift_imm(DisasContext_conflict6 *ctx,uint32_t opc,int rt,int rs,int16_t imm)

{
  TCGContext_conflict6 *tcg_ctx_00;
  uint arg2;
  long arg2_00;
  TCGv_i64 t;
  TCGv_i32 ret;
  TCGv_i32 t1;
  TCGv_i64 t0;
  target_ulong uimm;
  TCGContext_conflict6 *tcg_ctx;
  int16_t imm_local;
  int rs_local;
  int rt_local;
  uint32_t opc_local;
  DisasContext_conflict6 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  arg2 = (ushort)imm & 0x1f;
  arg2_00 = (long)(int)arg2;
  if (rt != 0) {
    t = tcg_temp_new_i64(tcg_ctx_00);
    gen_load_gpr(tcg_ctx_00,t,rs);
    if (opc == 0) {
      tcg_gen_shli_i64_mips64el(tcg_ctx_00,t,t,arg2_00);
      tcg_gen_ext32s_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_gpr[rt],t);
    }
    else if (opc == 2) {
      if (arg2_00 == 0) {
        tcg_gen_ext32s_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_gpr[rt],t);
      }
      else {
        tcg_gen_ext32u_i64_mips64el(tcg_ctx_00,t,t);
        tcg_gen_shri_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_gpr[rt],t,arg2_00);
      }
    }
    else if (opc == 3) {
      tcg_gen_sari_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_gpr[rt],t,arg2_00);
    }
    else if (opc == 0x38) {
      tcg_gen_shli_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_gpr[rt],t,arg2_00);
    }
    else if (opc == 0x3a) {
      tcg_gen_shri_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_gpr[rt],t,arg2_00);
    }
    else if (opc == 0x3b) {
      tcg_gen_sari_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_gpr[rt],t,arg2_00);
    }
    else if (opc == 0x3c) {
      tcg_gen_shli_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_gpr[rt],t,arg2_00 + 0x20);
    }
    else if (opc == 0x3e) {
      tcg_gen_shri_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_gpr[rt],t,arg2_00 + 0x20);
    }
    else if (opc == 0x3f) {
      tcg_gen_sari_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_gpr[rt],t,arg2_00 + 0x20);
    }
    else if (opc == 0x200002) {
      if (arg2_00 == 0) {
        tcg_gen_ext32s_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_gpr[rt],t);
      }
      else {
        ret = tcg_temp_new_i32(tcg_ctx_00);
        tcg_gen_extrl_i64_i32_mips64el(tcg_ctx_00,ret,t);
        tcg_gen_rotri_i32_mips64el(tcg_ctx_00,ret,ret,arg2);
        tcg_gen_ext_i32_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_gpr[rt],ret);
        tcg_temp_free_i32(tcg_ctx_00,ret);
      }
    }
    else if (opc == 0x20003a) {
      if (arg2_00 == 0) {
        tcg_gen_mov_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_gpr[rt],t);
      }
      else {
        tcg_gen_rotri_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_gpr[rt],t,arg2);
      }
    }
    else if (opc == 0x20003e) {
      tcg_gen_rotri_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_gpr[rt],t,arg2 + 0x20);
    }
    tcg_temp_free_i64(tcg_ctx_00,t);
  }
  return;
}

Assistant:

static void gen_shift_imm(DisasContext *ctx, uint32_t opc,
                          int rt, int rs, int16_t imm)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    target_ulong uimm = ((uint16_t)imm) & 0x1f;
    TCGv t0;

    if (rt == 0) {
        /* If no destination, treat it as a NOP. */
        return;
    }

    t0 = tcg_temp_new(tcg_ctx);
    gen_load_gpr(tcg_ctx, t0, rs);
    switch (opc) {
    case OPC_SLL:
        tcg_gen_shli_tl(tcg_ctx, t0, t0, uimm);
        tcg_gen_ext32s_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], t0);
        break;
    case OPC_SRA:
        tcg_gen_sari_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], t0, uimm);
        break;
    case OPC_SRL:
        if (uimm != 0) {
            tcg_gen_ext32u_tl(tcg_ctx, t0, t0);
            tcg_gen_shri_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], t0, uimm);
        } else {
            tcg_gen_ext32s_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], t0);
        }
        break;
    case OPC_ROTR:
        if (uimm != 0) {
            TCGv_i32 t1 = tcg_temp_new_i32(tcg_ctx);

            tcg_gen_trunc_tl_i32(tcg_ctx, t1, t0);
            tcg_gen_rotri_i32(tcg_ctx, t1, t1, uimm);
            tcg_gen_ext_i32_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], t1);
            tcg_temp_free_i32(tcg_ctx, t1);
        } else {
            tcg_gen_ext32s_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], t0);
        }
        break;
#if defined(TARGET_MIPS64)
    case OPC_DSLL:
        tcg_gen_shli_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], t0, uimm);
        break;
    case OPC_DSRA:
        tcg_gen_sari_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], t0, uimm);
        break;
    case OPC_DSRL:
        tcg_gen_shri_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], t0, uimm);
        break;
    case OPC_DROTR:
        if (uimm != 0) {
            tcg_gen_rotri_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], t0, uimm);
        } else {
            tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], t0);
        }
        break;
    case OPC_DSLL32:
        tcg_gen_shli_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], t0, uimm + 32);
        break;
    case OPC_DSRA32:
        tcg_gen_sari_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], t0, uimm + 32);
        break;
    case OPC_DSRL32:
        tcg_gen_shri_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], t0, uimm + 32);
        break;
    case OPC_DROTR32:
        tcg_gen_rotri_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], t0, uimm + 32);
        break;
#endif
    }
    tcg_temp_free(tcg_ctx, t0);
}